

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O3

size_t * scope_stack_return(scope sp)

{
  ulong uVar1;
  long *plVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  if ((sp == (scope)0x0) || (sp->call_stack == (vector)0x0)) {
    pcVar4 = "Scope stack return invalid parameters";
    uVar3 = 0x1fa;
  }
  else {
    uVar1 = vector_size();
    if (uVar1 < 8) {
      pcVar4 = "Scope stack return empty";
      uVar3 = 0x1f5;
    }
    else {
      plVar2 = (long *)vector_at(sp->call_stack,uVar1 - 9);
      if ((plVar2 != (long *)0x0) && ((size_t *)*plVar2 != (size_t *)0x0)) {
        return (size_t *)*plVar2;
      }
      pcVar4 = "Scope stack return invalid reference";
      uVar3 = 0x1f0;
    }
  }
  log_write_impl_va("metacall",uVar3,"scope_stack_return",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                    ,3,pcVar4);
  return (size_t *)0x0;
}

Assistant:

size_t *scope_stack_return(scope sp)
{
	if (sp != NULL && sp->call_stack != NULL)
	{
		size_t call_stack_size = vector_size(sp->call_stack);

		if (call_stack_size >= sizeof(size_t))
		{
			size_t return_position = call_stack_size - 1 - sizeof(size_t);

			void **return_ptr = vector_at(sp->call_stack, return_position);

			if (return_ptr != NULL && *return_ptr != NULL)
			{
				size_t *size_return_ptr = *return_ptr;

				return size_return_ptr;
			}

			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return invalid reference");

			return NULL;
		}

		log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return empty");

		return NULL;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope stack return invalid parameters");

	return NULL;
}